

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::WriteMatrix(ChSystemDescriptor *this,string *path,string *prefix)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  _func_int **pp_Var5;
  long *plVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename;
  ChVectorDynamic<double> rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ChSparseMatrix Z;
  ChStreamOutAsciiFile file_rhs;
  ChStreamOutAsciiFile file_Z;
  long *local_6d8;
  long local_6d0;
  long local_6c8;
  long lStack_6c0;
  char *local_6b8;
  undefined8 local_6b0;
  char local_6a8;
  undefined7 uStack_6a7;
  long local_698;
  long lStack_690;
  long *local_688 [2];
  long local_678 [2];
  _func_int **local_668;
  SparseMatrix<double,_1,_int> local_660;
  undefined1 local_610 [16];
  _func_int *local_600;
  long lStack_5f8;
  ChStreamOutAscii local_340;
  undefined1 local_320 [16];
  _func_int *local_310;
  long lStack_308;
  ChStreamOutAscii local_50;
  
  local_6b8 = &local_6a8;
  local_6b0 = 0;
  local_6a8 = '\0';
  local_660.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  local_660._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  local_660.m_outerSize = -1;
  local_660.m_innerSize = 0;
  local_660.m_outerIndex = (StorageIndex *)0x0;
  local_660.m_innerNonZeros = (StorageIndex *)0x0;
  local_660.m_data.m_values = (Scalar *)0x0;
  local_660.m_data.m_indices = (StorageIndex *)0x0;
  local_660.m_data.m_size = 0;
  local_660.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&local_660,0,0);
  local_698 = 0;
  lStack_690 = 0;
  (*this->_vptr_ChSystemDescriptor[0x1c])(this,&local_660);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_6d8 = &local_6c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d8,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)&local_6d8);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6d8,(ulong)(prefix->_M_dataplus)._M_p);
  pp_Var5 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var5) {
    local_600 = *pp_Var5;
    lStack_5f8 = plVar4[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var5;
    local_610._0_8_ = (_func_int **)*plVar4;
  }
  local_610._8_8_ = plVar4[1];
  local_668 = (_func_int **)&PTR_SetElement_00b0c488;
  *plVar4 = (long)pp_Var5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_610);
  pp_Var5 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var5) {
    local_310 = *pp_Var5;
    lStack_308 = plVar4[3];
    local_320._0_8_ = &local_310;
  }
  else {
    local_310 = *pp_Var5;
    local_320._0_8_ = (_func_int **)*plVar4;
  }
  local_320._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_320);
  if ((_func_int **)local_320._0_8_ != &local_310) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_310 + 1));
  }
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8,local_6c8 + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320,local_6b8,_S_trunc);
  builtin_strncpy(local_50.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&local_660,&local_50);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_688,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_688);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_688,(ulong)(prefix->_M_dataplus)._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_6c8 = *plVar6;
    lStack_6c0 = plVar4[3];
    local_6d8 = &local_6c8;
  }
  else {
    local_6c8 = *plVar6;
    local_6d8 = (long *)*plVar4;
  }
  local_6d0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6d8);
  pp_Var5 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var5) {
    local_600 = *pp_Var5;
    lStack_5f8 = plVar4[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var5;
    local_610._0_8_ = (_func_int **)*plVar4;
  }
  local_610._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_610);
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8,local_6c8 + 1);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0],local_678[0] + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610,local_6b8,_S_trunc);
  lVar3 = lStack_690;
  lVar2 = local_698;
  builtin_strncpy(local_340.number_format,"%.12g",6);
  if (-1 < lStack_690 || local_698 == 0) {
    if (0 < lStack_690) {
      lVar7 = 0;
      do {
        if (lVar3 <= lVar7) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        ChStreamOutAscii::operator<<(&local_340,*(double *)(lVar2 + lVar7 * 8));
        ChStreamOutAscii::operator<<(&local_340,"\n");
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610);
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320);
    if (local_698 != 0) {
      free(*(void **)(local_698 + -8));
    }
    local_660._vptr_SparseMatrix = local_668;
    free(local_660.m_outerIndex);
    free(local_660.m_innerNonZeros);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_660.m_data);
    if (local_6b8 != &local_6a8) {
      operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
    }
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChSystemDescriptor::WriteMatrix(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    ChSparseMatrix Z;
    ChVectorDynamic<double> rhs;
    ConvertToMatrixForm(&Z, &rhs);

    filename = path + "/" + prefix + "_Z.dat";
    ChStreamOutAsciiFile file_Z(filename.c_str());
    file_Z.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(Z, file_Z);

    filename = path + "/" + prefix + "_rhs.dat";
    ChStreamOutAsciiFile file_rhs(filename.c_str());
    file_rhs.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(rhs, file_rhs);
}